

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void start_pass_1_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  J_DITHER_MODE JVar1;
  JDIMENSION JVar2;
  jpeg_color_quantizer *pjVar3;
  int local_2c;
  int i;
  size_t arraysize;
  my_cquantize_ptr cquantize;
  boolean is_pre_scan_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar3[1].start_pass;
  cinfo->actual_number_of_colors = *(int *)&pjVar3[1].color_quantize;
  JVar1 = cinfo->dither_mode;
  if (JVar1 == JDITHER_NONE) {
    if (cinfo->out_color_components == 3) {
      pjVar3->color_quantize = color_quantize3;
    }
    else {
      pjVar3->color_quantize = color_quantize;
    }
  }
  else if (JVar1 == JDITHER_ORDERED) {
    if (cinfo->out_color_components == 3) {
      pjVar3->color_quantize = quantize3_ord_dither;
    }
    else {
      pjVar3->color_quantize = quantize_ord_dither;
    }
    *(undefined4 *)((long)&pjVar3[2].color_quantize + 4) = 0;
    if (*(int *)&pjVar3[1].new_color_map == 0) {
      create_colorindex(cinfo);
    }
    if (pjVar3[2].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      create_odither_tables(cinfo);
    }
  }
  else if (JVar1 == JDITHER_FS) {
    pjVar3->color_quantize = quantize_fs_dither;
    *(undefined4 *)&pjVar3[4].finish_pass = 0;
    if (pjVar3[3].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      alloc_fs_workspace(cinfo);
    }
    JVar2 = cinfo->output_width;
    for (local_2c = 0; local_2c < cinfo->out_color_components; local_2c = local_2c + 1) {
      memset((&pjVar3[3].finish_pass)[local_2c],0,(ulong)(JVar2 + 2) << 1);
    }
  }
  else {
    cinfo->err->msg_code = 0x31;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_1_quant (j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  size_t arraysize;
  int i;

  /* Install my colormap. */
  cinfo->colormap = cquantize->sv_colormap;
  cinfo->actual_number_of_colors = cquantize->sv_actual;

  /* Initialize for desired dithering mode. */
  switch (cinfo->dither_mode) {
  case JDITHER_NONE:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = color_quantize3;
    else
      cquantize->pub.color_quantize = color_quantize;
    break;
  case JDITHER_ORDERED:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = quantize3_ord_dither;
    else
      cquantize->pub.color_quantize = quantize_ord_dither;
    cquantize->row_index = 0;	/* initialize state for ordered dither */
    /* If user changed to ordered dither from another mode,
     * we must recreate the color index table with padding.
     * This will cost extra space, but probably isn't very likely.
     */
    if (! cquantize->is_padded)
      create_colorindex(cinfo);
    /* Create ordered-dither tables if we didn't already. */
    if (cquantize->odither[0] == NULL)
      create_odither_tables(cinfo);
    break;
  case JDITHER_FS:
    cquantize->pub.color_quantize = quantize_fs_dither;
    cquantize->on_odd_row = FALSE; /* initialize state for F-S dither */
    /* Allocate Floyd-Steinberg workspace if didn't already. */
    if (cquantize->fserrors[0] == NULL)
      alloc_fs_workspace(cinfo);
    /* Initialize the propagated errors to zero. */
    arraysize = (size_t) ((cinfo->output_width + 2) * SIZEOF(FSERROR));
    for (i = 0; i < cinfo->out_color_components; i++)
      FMEMZERO((void FAR *) cquantize->fserrors[i], arraysize);
    break;
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }
}